

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration_C.cpp
# Opt level: O0

void cnip::CConfiguration::extend(Options *cmdLineOpts)

{
  element_type *peVar1;
  OptionAdder *pOVar2;
  allocator<char> local_6d9;
  string local_6d8;
  shared_ptr<cxxopts::Value> local_6b8;
  shared_ptr<const_cxxopts::Value> local_6a8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618 [32];
  shared_ptr<cxxopts::Value> local_5f8;
  shared_ptr<cxxopts::Value> local_5e8;
  shared_ptr<const_cxxopts::Value> local_5d8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548 [32];
  shared_ptr<cxxopts::Value> local_528;
  shared_ptr<cxxopts::Value> local_518;
  shared_ptr<const_cxxopts::Value> local_508;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  shared_ptr<cxxopts::Value> local_480;
  shared_ptr<const_cxxopts::Value> local_470;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  shared_ptr<cxxopts::Value> local_3e8;
  shared_ptr<const_cxxopts::Value> local_3d8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  shared_ptr<cxxopts::Value> local_350;
  shared_ptr<const_cxxopts::Value> local_340;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0 [32];
  shared_ptr<cxxopts::Value> local_290;
  shared_ptr<cxxopts::Value> local_280;
  shared_ptr<const_cxxopts::Value> local_270;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0 [32];
  shared_ptr<cxxopts::Value> local_1c0;
  shared_ptr<cxxopts::Value> local_1b0;
  shared_ptr<const_cxxopts::Value> local_1a0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110 [32];
  shared_ptr<cxxopts::Value> local_f0;
  shared_ptr<cxxopts::Value> local_e0;
  shared_ptr<const_cxxopts::Value> local_d0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  OptionAdder local_38;
  Options *local_10;
  Options *cmdLineOpts_local;
  
  local_10 = cmdLineOpts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  cxxopts::Options::add_options(&local_38,cmdLineOpts,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"C-compiler",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Select the compiler.",&local_b9);
  cxxopts::value<std::__cxx11::string>();
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"gcc",&local_111);
  (*peVar1->_vptr_Value[10])(&local_e0,peVar1,local_110);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_d0,&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"{gcc,clang}",&local_139);
  pOVar2 = cxxopts::OptionAdder::operator()(&local_38,&local_90,&local_b8,&local_d0,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"C-std",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"Select the standard.",&local_189);
  cxxopts::value<std::__cxx11::string>();
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"c11",&local_1e1);
  (*peVar1->_vptr_Value[10])(&local_1b0,peVar1,local_1e0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1a0,&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"{c89,c90,c99,c11,c17}",&local_209);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_160,&local_188,&local_1a0,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"C-pp-includes",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Preprocess `#include\' directives.",&local_259);
  cxxopts::value<bool>();
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"false",&local_2b1);
  (*peVar1->_vptr_Value[10])(&local_280,peVar1,local_2b0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_270,&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"",&local_2d9);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_230,&local_258,&local_270,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"C-I",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "Add directory <dir> to the search path of `#include\' directives.",&local_329);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_340,&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"<dir>",&local_371);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_300,&local_328,&local_340,&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"C-D",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"Define macro <name> with <value> (or 1 if <value> omitted).",
             &local_3c1);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_3d8,&local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"<name>=<value>",&local_409);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_398,&local_3c0,&local_3d8,&local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"C-U",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"Undefine macro <name>.",&local_459);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_470,&local_480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"<name>",&local_4a1);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_430,&local_458,&local_470,&local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"C-comment-mode",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,
             "Select the comment mode: D=discard, KA=keep all, KOD=keep only documentation",
             &local_4f1);
  cxxopts::value<std::__cxx11::string>();
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_548,"D",&local_549);
  (*peVar1->_vptr_Value[10])(&local_518,peVar1,local_548);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_508,&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"{D,KA,KOD}",&local_571);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_4c8,&local_4f0,&local_508,&local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"C-ambiguity-mode",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,
             "Select the ambiguity mode: D=diagnose, DA=disambiguate algorithmically, DAH=disambiguate algorithmically and heuristically, DH=disambiguate heuristically."
             ,&local_5c1);
  cxxopts::value<std::__cxx11::string>();
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_618,"DAH",&local_619);
  (*peVar1->_vptr_Value[10])(&local_5e8,peVar1,local_618);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_5d8,&local_5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"{D,DA,DAH,DH}",&local_641);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_598,&local_5c0,&local_5d8,&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"C-infer-types",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"Infer missing types.",&local_691);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_6a8,&local_6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"",&local_6d9);
  cxxopts::OptionAdder::operator()(pOVar2,&local_668,&local_690,&local_6a8,&local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_6a8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_6b8);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_5d8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_5e8);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_5f8);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_508);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_518);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_528);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_470);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_480);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_3d8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_340);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_350);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_270);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_280);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_290);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1a0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1b0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1c0);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_d0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_e0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_f0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

void CConfiguration::extend(cxxopts::Options& cmdLineOpts)
{
    cmdLineOpts.add_options()

        /* Compiler */
            (kCompiler,
                "Select the compiler.",
                cxxopts::value<std::string>()->default_value("gcc"),
                "{gcc,clang}")

        /* Language */
            // https://gcc.gnu.org/onlinedocs/gcc/C-Dialect-Options.html#C-Dialect-Options
            (kStd,
                "Select the standard.",
                cxxopts::value<std::string>()->default_value("c11"),
                "{c89,c90,c99,c11,c17}")

        /* Preprocessor */
            (kPPInclude,
                "Preprocess `#include' directives.",
                cxxopts::value<bool>()->default_value("false"))

            // https://gcc.gnu.org/onlinedocs/gcc/Directory-Options.html
            (kSearchPaths,
                "Add directory <dir> to the search path of `#include' directives.",
                cxxopts::value<std::vector<std::string>>(),
                "<dir>")

            // https://gcc.gnu.org/onlinedocs/gcc/Preprocessor-Options.html
            (kDefinedMacros,
                "Define macro <name> with <value> (or 1 if <value> omitted).",
                cxxopts::value<std::vector<std::string>>(),
                "<name>=<value>")
            (KUndefedMacros,
                "Undefine macro <name>.",
                cxxopts::value<std::vector<std::string>>(),
                "<name>")

        /* Parser */
            (kCommentMode,
                "Select the comment mode: "
                "D=discard, "
                "KA=keep all, "
                "KOD=keep only documentation",
                cxxopts::value<std::string>()
                    ->default_value("D"),
                "{D,KA,KOD}")

            (kAmbigMode,
                "Select the ambiguity mode: "
                "D=diagnose, "
                "DA=disambiguate algorithmically, "
                "DAH=disambiguate algorithmically and heuristically, "
                "DH=disambiguate heuristically.",
                cxxopts::value<std::string>()
                    ->default_value("DAH"),
                "{D,DA,DAH,DH}")

        /* Type inference */
            ("C-infer-types", "Infer missing types.")

        ;
//            ("o,output", "Specify output file",
//                cxxopts::value<std::string>()->default_value("a.cstr"))
}